

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O0

HRRDoubletStepList * __thiscall
OSTEI_HRR_Algorithm_Base::GetKetSteps(OSTEI_HRR_Algorithm_Base *this,DAM *am)

{
  size_type sVar1;
  map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
  *in_RDX;
  DAM *in_RDI;
  key_type *in_stack_ffffffffffffff48;
  DAM *this_00;
  vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *in_stack_ffffffffffffff88;
  vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *in_stack_ffffffffffffff90;
  
  this_00 = in_RDI;
  DAM::notag(in_RDI);
  sVar1 = std::
          map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
          ::count(in_RDX,in_stack_ffffffffffffff48);
  DAM::~DAM((DAM *)0x134e66);
  if (sVar1 == 0) {
    memset(in_RDI,0,0x18);
    std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::vector
              ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)0x134f22);
  }
  else {
    DAM::notag(in_RDI);
    std::
    map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
    ::at((map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
          *)this_00,in_RDI);
    std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::vector
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    DAM::~DAM((DAM *)0x134ec8);
  }
  return (HRRDoubletStepList *)this_00;
}

Assistant:

HRRDoubletStepList OSTEI_HRR_Algorithm_Base::GetKetSteps(DAM am) const
{
    if(ketsteps_.count(am.notag()))
        return ketsteps_.at(am.notag());
    else
        return HRRDoubletStepList();
}